

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

void __thiscall
LargeGapGrayCode::createCodeFromTheorem2(LargeGapGrayCode *this,int n,int m,int r,int s,int t)

{
  bool bVar1;
  reference this_00;
  reference this_01;
  ostream *poVar2;
  __type _Var3;
  string local_240 [32];
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> t_1;
  vector<char,_std::allocator<char>_> Z;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> Q;
  vector<char,_std::allocator<char>_> P;
  int t_local;
  int s_local;
  int r_local;
  int m_local;
  int n_local;
  LargeGapGrayCode *this_local;
  
  if ((((m <= n) && (r <= m)) && (0 < r)) &&
     ((bVar1 = isOddPositive(this,s), bVar1 && (bVar1 = isOddPositive(this,t), bVar1)))) {
    _Var3 = std::pow<int,int>(2,r);
    if (((double)(s + t) == _Var3) && ((!NAN((double)(s + t)) && !NAN(_Var3) && (n + m + r < 0x15)))
       ) {
      createPVector((vector<char,_std::allocator<char>_> *)
                    &Q.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,this,s,t);
      _Var3 = std::pow<int,int>(2,n);
      multiCopyVector((vector<char,_std::allocator<char>_> *)local_58,this,
                      (vector<char,_std::allocator<char>_> *)
                      &Q.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                      (int)_Var3);
      replaceLastBWithC(this,(vector<char,_std::allocator<char>_> *)local_58);
      _Var3 = std::pow<int,int>(2,m);
      multiCopyVector((vector<char,_std::allocator<char>_> *)
                      &t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,this,
                      (vector<char,_std::allocator<char>_> *)local_58,(int)_Var3);
      createTransitionSequenceTheorem2
                ((vector<int,_std::allocator<int>_> *)local_98,this,n,m,r,
                 (vector<char,_std::allocator<char>_> *)
                 &t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->m_transitionSequences,(long)(r + -1 + n + m));
      std::vector<int,_std::allocator<int>_>::operator=
                (this_00,(vector<int,_std::allocator<int>_> *)local_98);
      std::__cxx11::stringstream::stringstream(local_220);
      poVar2 = std::operator<<(local_210,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
      poVar2 = std::operator<<(poVar2," + ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,m);
      poVar2 = std::operator<<(poVar2," + ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,r);
      std::operator<<(poVar2,")");
      std::__cxx11::stringstream::str();
      this_01 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->m_creationMethod,(long)(n + m + r + -1));
      std::__cxx11::string::operator=((string *)this_01,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::stringstream::~stringstream(local_220);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98)
      ;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 &t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_58);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 &Q.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      return;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Constraints for Theorem 2 are not satisfied.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LargeGapGrayCode::createCodeFromTheorem2(int n, int m, int r, int s, int t)
{
	if(n >= m && m >= r && r >= 1 && isOddPositive(s) && isOddPositive(t) && (s+t) == pow(2,r) && (n+m+r <= maxBitWidth)) {
		std::vector<char> P = createPVector(s, t);
		std::vector<char> Q = multiCopyVector(P, pow(2, n));
		replaceLastBWithC(Q);
		std::vector<char> Z = multiCopyVector(Q, pow(2, m));
		std::vector<int> t = createTransitionSequenceTheorem2(n, m, r, Z);
		m_transitionSequences[n+m+r-1] = t;
		std::stringstream ss;
		ss << "(" << n << " + " << m << " + " << r << ")";
		m_creationMethod[n+m+r-1] = ss.str();
	}
	else {
		std::cout << "Constraints for Theorem 2 are not satisfied." << std::endl;
	}
}